

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O0

void __thiscall lsh::vector::vector(vector *this,vector<bool,_std::allocator<bool>_> *cs)

{
  const_reference cVar1;
  size_type sVar2;
  uint local_54;
  uint local_40;
  value_type_conflict local_3c;
  uint j;
  uint e;
  uint b;
  uint local_28;
  uint local_24;
  uint n;
  uint i;
  uint c;
  uint s;
  vector<bool,_std::allocator<bool>_> *cs_local;
  vector *this_local;
  
  _c = cs;
  cs_local = (vector<bool,_std::allocator<bool>_> *)this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->components_);
  sVar2 = std::vector<bool,_std::allocator<bool>_>::size(_c);
  this->size_ = (uint)sVar2;
  i = this->size_;
  n = 0x20;
  local_24 = 0;
  local_28 = (i + 0x1f) / 0x20;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&this->components_,(ulong)local_28);
  for (; local_24 < i; local_24 = j + local_24) {
    if (i < local_24 + n) {
      local_54 = i - local_24;
    }
    else {
      local_54 = n;
    }
    j = local_54;
    local_3c = 0;
    for (local_40 = 0; local_40 < j; local_40 = local_40 + 1) {
      cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](_c,(ulong)(local_24 + local_40));
      local_3c = (uint)cVar1 << (((char)j - (char)local_40) - 1U & 0x1f) | local_3c;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->components_,&local_3c);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::shrink_to_fit(&this->components_);
  return;
}

Assistant:

vector::vector(const std::vector<bool>& cs) {
    this->size_ = cs.size();

    unsigned int s = this->size_;
    unsigned int c = this->chunk_size_;
    unsigned int i = 0;
    unsigned int n = (s + c - 1) / c;

    this->components_.reserve(n);

    while (i < s) {
      // Compute the number of bits in the current chunk.
      unsigned int b = i + c > s ? s - i : c;

      unsigned int e = 0;

      for (unsigned int j = 0; j < b; j++) {
        e |= cs[i + j] << (b - j - 1);
      }

      this->components_.push_back(e);

      i += b;
    }

    this->components_.shrink_to_fit();
  }